

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall Catch::RunContext::runTest(RunContext *this,TestCase *testCase)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  RunContext *this_00;
  pointer pIVar5;
  SectionTracker *_stdErr;
  element_type *peVar6;
  undefined4 extraout_var;
  SectionTracker *pSVar7;
  TestCase *in_RDX;
  long *in_RSI;
  TestCaseStats *in_RDI;
  ITracker *rootTracker;
  TestCaseInfo *testInfo;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  Totals *deltaTotals;
  Totals *in_stack_fffffffffffffd08;
  RunContext *in_stack_fffffffffffffd10;
  undefined6 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1e;
  undefined1 in_stack_fffffffffffffd1f;
  Totals *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2d;
  byte bVar8;
  undefined1 _aborting;
  SectionTracker *this_01;
  TestCaseStats *this_02;
  undefined1 local_288 [32];
  NameAndLocation *in_stack_fffffffffffffd98;
  TrackerContext *in_stack_fffffffffffffda0;
  TrackerContext *in_stack_fffffffffffffdb0;
  string local_c8 [24];
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  RunContext *in_stack_ffffffffffffff60;
  key_type *__k;
  
  this_02 = in_RDI;
  Totals::Totals((Totals *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff58);
  std::__cxx11::string::string(local_c8);
  this_00 = (RunContext *)TestCase::getTestCaseInfo(in_RDX);
  (**(code **)(*in_RSI + 0x48))();
  pIVar5 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x13e2b9);
  (*pIVar5->_vptr_IStreamingReporter[7])(pIVar5,this_00);
  in_RSI[7] = (long)in_RDX;
  _stdErr = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(in_stack_fffffffffffffdb0);
  this_01 = _stdErr;
  peVar6 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x13e31e);
  iVar4 = (*(peVar6->super_NonCopyable)._vptr_NonCopyable[0x19])();
  __k = (key_type *)CONCAT44(extraout_var,iVar4);
  TestCaseTracking::SectionTracker::addInitialFilters
            (this_01,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)__k);
  do {
    TestCaseTracking::TrackerContext::startCycle((TrackerContext *)in_stack_fffffffffffffd10);
    _aborting = (undefined1)((ulong)(in_RSI + 0x40) >> 0x38);
    TestCaseTracking::NameAndLocation::NameAndLocation
              ((NameAndLocation *)in_stack_fffffffffffffd20,
               (string *)
               CONCAT17(in_stack_fffffffffffffd1f,
                        CONCAT16(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18)),
               (SourceLineInfo *)in_stack_fffffffffffffd10);
    pSVar7 = TestCaseTracking::SectionTracker::acquire
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    in_RSI[8] = (long)pSVar7;
    TestCaseTracking::NameAndLocation::~NameAndLocation((NameAndLocation *)0x13e3bf);
    runCurrentTest(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    bVar1 = (**(code **)(*(long *)in_RSI[8] + 0x18))();
    bVar8 = 0;
    if ((bVar1 & 1) == 0) {
      in_stack_fffffffffffffd2d = aborting(in_stack_fffffffffffffd10);
      bVar8 = in_stack_fffffffffffffd2d ^ 0xff;
    }
  } while ((bVar8 & 1) != 0);
  bVar2 = (**(code **)(*in_RSI + 0x58))();
  if ((bVar2 & 1) != 0) {
    in_RSI[0x1f] = in_RSI[0x1f] + 1;
    in_stack_fffffffffffffd20 =
         (Totals *)
         clara::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       *)this_01,__k);
    *(mapped_type *)in_stack_fffffffffffffd20 = *(mapped_type *)in_stack_fffffffffffffd20 + 1;
  }
  Totals::delta((Totals *)
                CONCAT17(bVar1,CONCAT16(bVar8,CONCAT15(in_stack_fffffffffffffd2d,
                                                       CONCAT14(bVar2,in_stack_fffffffffffffd28)))),
                in_stack_fffffffffffffd20);
  bVar3 = TestCaseInfo::expectedToFail((TestCaseInfo *)this_00);
  if ((bVar3) && (*(long *)&(in_RDI->testInfo).className != 0)) {
    (in_RDI->testInfo).name.field_2._M_allocated_capacity =
         (in_RDI->testInfo).name.field_2._M_allocated_capacity + 1;
    *(long *)&(in_RDI->testInfo).className = *(long *)&(in_RDI->testInfo).className + -1;
    (in_RDI->testInfo).className._M_string_length =
         (in_RDI->testInfo).className._M_string_length + 1;
  }
  Counts::operator+=((Counts *)(in_RSI + 0x23),(Counts *)&(in_RDI->testInfo).className);
  pIVar5 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x13e592);
  aborting(this_00);
  TestCaseStats::TestCaseStats
            (this_02,(TestCaseInfo *)in_RDI,(Totals *)this_01,__k,(string *)_stdErr,(bool)_aborting)
  ;
  (*pIVar5->_vptr_IStreamingReporter[0xc])(pIVar5,local_288);
  TestCaseStats::~TestCaseStats((TestCaseStats *)this_00);
  in_RSI[7] = 0;
  in_RSI[8] = 0;
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  Totals::~Totals((Totals *)0x13e67d);
  return (Totals *)this_02;
}

Assistant:

Totals RunContext::runTest(TestCase const& testCase) {
        Totals prevTotals = m_totals;

        std::string redirectedCout;
        std::string redirectedCerr;

        auto const& testInfo = testCase.getTestCaseInfo();

        onTestBegin();
        m_reporter->testCaseStarting(testInfo);

        m_activeTestCase = &testCase;

        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(testInfo.name, testInfo.lineInfo));
            runCurrentTest(redirectedCout, redirectedCerr);
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        if (skippedTest()) {
            m_totals.skippedTests++;
            m_totals.skippedTestReasons[m_skippedTestReason]++;
        }
        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  redirectedCout,
                                  redirectedCerr,
                                  aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }